

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-iosim.c
# Opt level: O0

void iosim(char *filename)

{
  double dVar1;
  int iVar2;
  char *pcVar3;
  void *pvVar4;
  FILE *__stream;
  ulong uVar5;
  size_t in_stack_ffffffffffffec78;
  undefined4 uVar6;
  FILE *fp;
  char timelog [4096];
  log *times;
  int j_1;
  int j;
  long local_328;
  int local_31c;
  ptrdiff_t pStack_318;
  int nextTask;
  size_t oldsize;
  log trank;
  double t1;
  double t0;
  ptrdiff_t i;
  uint64_t *fakedata;
  BigBlockPtr ptr;
  undefined1 local_2a8 [8];
  BigArray array;
  BigBlock bb;
  BigFile local_30;
  BigFile bf;
  size_t localsize;
  size_t start;
  size_t elsize;
  char *filename_local;
  
  if (aggregated == 0) {
    big_file_mpi_set_aggregated_threshold(0);
  }
  else {
    big_file_mpi_set_aggregated_threshold(size * (long)nmemb * 8);
  }
  local_30.basename = (char *)0x0;
  array.data = (void *)0x0;
  memset(local_2a8,0,0x220);
  fakedata._0_4_ = 0;
  fakedata._4_4_ = 0;
  ptr.fileid = 0;
  ptr._4_4_ = 0;
  ptr.roffset = 0;
  info("iosim.c: started.\n");
  big_file_mpi_set_verbose(1);
  trank.read = 0.0;
  trank.write = 0.0;
  trank.open = 0.0;
  trank.create = 0.0;
  oldsize = 0;
  pStack_318 = 0;
  if (mode == 0) {
    info("Creating BigFile\n");
    dVar1 = (double)MPI_Wtime();
    big_file_mpi_create(&local_30,filename,(MPI_Comm)&ompi_mpi_comm_world);
    trank.close = (double)MPI_Wtime();
    oldsize = (size_t)((trank.close - dVar1) + (double)oldsize);
    info("Created BigFile\n");
    info("Creating BigBlock\n");
    dVar1 = (double)MPI_Wtime();
    in_stack_ffffffffffffec78 = size;
    big_file_mpi_create_block
              (&local_30,(BigBlock *)&array.data,"TestBlock","i8",nmemb,Nfile,size,
               (MPI_Comm)&ompi_mpi_comm_world);
    trank.close = (double)MPI_Wtime();
    oldsize = (size_t)((trank.close - dVar1) + (double)oldsize);
    info("Created BigBlock\n");
    big_block_seek((BigBlock *)&array.data,(BigBlockPtr *)&fakedata,0);
  }
  else if (mode - 1U < 2) {
    info("Opening BigFile\n");
    dVar1 = (double)MPI_Wtime();
    iVar2 = big_file_mpi_open(&local_30,filename,(MPI_Comm)&ompi_mpi_comm_world);
    if (iVar2 != 0) {
      pcVar3 = big_file_get_error_message();
      printf("%s\n",pcVar3);
      return;
    }
    trank.close = (double)MPI_Wtime();
    trank.create = (trank.close - dVar1) + trank.create;
    info("Opened BigFile\n");
    info("Opening BigBlock\n");
    dVar1 = (double)MPI_Wtime();
    big_file_mpi_open_block
              (&local_30,(BigBlock *)&array.data,"TestBlock",(MPI_Comm)&ompi_mpi_comm_world);
    trank.close = (double)MPI_Wtime();
    trank.create = (trank.close - dVar1) + trank.create;
    info("Opened BigBlock\n");
    size = 0;
    nmemb = 0;
    Nfile = 0;
    big_block_seek((BigBlock *)&array.data,(BigBlockPtr *)&fakedata,0);
  }
  else {
    if (mode != 3) {
      abort();
    }
    info("Growing BigFile\n");
    dVar1 = (double)MPI_Wtime();
    iVar2 = big_file_mpi_open(&local_30,filename,(MPI_Comm)&ompi_mpi_comm_world);
    if (iVar2 != 0) {
      pcVar3 = big_file_get_error_message();
      printf("%s\n",pcVar3);
      return;
    }
    trank.close = (double)MPI_Wtime();
    trank.create = (trank.close - dVar1) + trank.create;
    info("Opened BigFile\n");
    info("Opening BigBlock\n");
    dVar1 = (double)MPI_Wtime();
    big_file_mpi_open_block
              (&local_30,(BigBlock *)&array.data,"TestBlock",(MPI_Comm)&ompi_mpi_comm_world);
    pStack_318 = 0;
    big_block_mpi_grow_simple((BigBlock *)&array.data,Nfile,size,(MPI_Comm)&ompi_mpi_comm_world);
    trank.close = (double)MPI_Wtime();
    trank.create = (trank.close - dVar1) + trank.create;
    info("Opened BigBlock\n");
    nmemb = 0;
    big_block_seek((BigBlock *)&array.data,(BigBlockPtr *)&fakedata,pStack_318);
  }
  if (ThisTask % 2 == 0) {
    localsize = (size * (long)ThisTask) / (ulong)(long)NTask;
    local_31c = ThisTask + 2;
    if (NTask < local_31c) {
      local_31c = NTask;
    }
    uVar5 = (size * (long)local_31c) % (ulong)(long)NTask;
    bf.basename = (char *)((size * (long)local_31c) / (ulong)(long)NTask - localsize);
  }
  else {
    uVar5 = size * (long)(ThisTask + -1);
    localsize = uVar5 / (ulong)(long)NTask;
    uVar5 = uVar5 % (ulong)(long)NTask;
    bf.basename = (char *)0x0;
  }
  info("Writing to `%s`\n",filename,uVar5);
  info("mode %s\n",MODES[mode]);
  info("nmemb %d\n",(ulong)(uint)nmemb);
  info("Size %td\n",size);
  info("NBlobFiles %td\n",(ulong)(uint)Nfile);
  info("BytesPerBlob %td\n",(ulong)(uint)Nfile);
  info("Ranks %d\n",(ulong)(uint)NTask);
  info("Writers %d\n",(ulong)(uint)Nwriter);
  info("Aggregated %d\n",(ulong)(uint)aggregated);
  info("LocalBytes %td\n",(long)bf.basename * 8 * (long)nmemb);
  info("LocalSize %td\n",bf.basename);
  pvVar4 = malloc((long)bf.basename * 8 * (long)nmemb);
  _j_1 = bf.basename;
  local_328 = (long)nmemb;
  big_array_init((BigArray *)local_2a8,pvVar4,"i8",2,(size_t *)&j_1,(ptrdiff_t *)0x0);
  if (mode != 0) {
    if (mode == 1) {
      info("Reading BigBlock\n");
      dVar1 = (double)MPI_Wtime();
      iVar2 = big_block_mpi_read((BigBlock *)&array.data,(BigBlockPtr *)&fakedata,
                                 (BigArray *)local_2a8,Nwriter,(MPI_Comm)&ompi_mpi_comm_world);
      if (iVar2 != 0) {
        pcVar3 = big_file_get_error_message();
        info("Error occured: %s\n",pcVar3);
      }
      trank.close = (double)MPI_Wtime();
      trank.write = (trank.close - dVar1) + trank.write;
      info("Reading took %f seconds\n",SUB84(trank.write,0));
      info("Initializing FakeData\n");
      for (t0 = 0.0; (ulong)t0 < bf.basename; t0 = (double)((long)t0 + 1)) {
        for (times._0_4_ = 0; (int)times < nmemb; times._0_4_ = (int)times + 1) {
          if (*(long *)((long)pvVar4 + ((long)t0 * (long)nmemb + (long)(int)times) * 8) !=
              localsize + (long)t0) {
            info("data is corrupted either due to reading or writing\n");
            abort();
          }
        }
      }
      info("Initialized FakeData\n");
      goto LAB_001043f1;
    }
    if (mode != 2 && mode != 3) goto LAB_001043f1;
  }
  info("Initializing FakeData\n");
  for (t0 = 0.0; (ulong)t0 < bf.basename; t0 = (double)((long)t0 + 1)) {
    for (times._4_4_ = 0; times._4_4_ < nmemb; times._4_4_ = times._4_4_ + 1) {
      *(size_t *)((long)pvVar4 + ((long)t0 * (long)nmemb + (long)times._4_4_) * 8) =
           localsize + (long)t0;
    }
  }
  info("Initialized FakeData\n");
  info("Writing BigBlock\n");
  dVar1 = (double)MPI_Wtime();
  iVar2 = big_block_mpi_write((BigBlock *)&array.data,(BigBlockPtr *)&fakedata,(BigArray *)local_2a8
                              ,Nwriter,(MPI_Comm)&ompi_mpi_comm_world);
  if (iVar2 != 0) {
    pcVar3 = big_file_get_error_message();
    info("Error occured: %s\n",pcVar3);
  }
  trank.close = (double)MPI_Wtime();
  trank.open = (trank.close - dVar1) + trank.open;
  info("Written BigBlock\n");
  info("Writing took %f seconds\n",SUB84(trank.open,0));
LAB_001043f1:
  info("Closing BigBlock\n");
  dVar1 = (double)MPI_Wtime();
  big_block_mpi_close((BigBlock *)&array.data,(MPI_Comm)&ompi_mpi_comm_world);
  trank.close = (double)MPI_Wtime();
  trank.read = (trank.close - dVar1) + trank.read;
  info("Closed BigBlock\n");
  info("Closing BigFile\n");
  dVar1 = (double)MPI_Wtime();
  big_file_mpi_close(&local_30,(MPI_Comm)&ompi_mpi_comm_world);
  trank.close = (double)MPI_Wtime();
  trank.read = (trank.close - dVar1) + trank.read;
  info("Closed BigFile\n");
  free(pvVar4);
  pvVar4 = malloc((long)NTask * 0x28);
  uVar6 = 0;
  MPI_Gather(&oldsize,0x28,&ompi_mpi_byte,pvVar4,0x28,&ompi_mpi_byte,
             in_stack_ffffffffffffec78 & 0xffffffff00000000,&ompi_mpi_comm_world);
  if (ThisTask == 0) {
    sprintf((char *)&fp,"%s/%s-timelog",filename,MODES[mode]);
    __stream = fopen((char *)&fp,"a+");
    if (__stream == (FILE *)0x0) {
      info("iosim.c: Couldn\'t open file %s for writting!\n",&fp);
    }
    else {
      fprintf(__stream,"# mode\tNfile\tranks\twriters\titems\tnmemb\n%s\t%d\t%d\t%d\t%td\t%d\n",
              MODES[mode],(ulong)(uint)Nfile,(ulong)(uint)NTask,(ulong)(uint)Nwriter,size,
              CONCAT44(uVar6,nmemb));
      fprintf(__stream,"# Task\tTcreate\t\tTopen\t\tTwrite\t\tTread\t\tTclose\n");
      for (t0 = 0.0; (long)t0 < (long)NTask; t0 = (double)((long)t0 + 1)) {
        fprintf(__stream,"%04td\t%012.8f\t%012.8f\t%012.8f\t%012.8f\t%012.8f\n",
                (int)*(undefined8 *)((long)pvVar4 + (long)t0 * 0x28),
                *(undefined8 *)((long)pvVar4 + (long)t0 * 0x28 + 8),
                *(undefined8 *)((long)pvVar4 + (long)t0 * 0x28 + 0x10),
                *(undefined8 *)((long)pvVar4 + (long)t0 * 0x28 + 0x18),
                *(undefined8 *)((long)pvVar4 + (long)t0 * 0x28 + 0x20),t0);
      }
    }
    fclose(__stream);
  }
  free(pvVar4);
  return;
}

Assistant:

static void
iosim(char * filename)
{
    size_t elsize = 8;
    size_t start;
    size_t localsize;
    
    if(aggregated) {
        /* Use a large enough number to force aggregated IO */
        big_file_mpi_set_aggregated_threshold(size * nmemb * 8);
    } else {
        /* Use 0 to force no aggregated IO */
        big_file_mpi_set_aggregated_threshold(0);
    }
    BigFile bf = {0};
    BigBlock bb = {0};
    BigArray array = {0};
    BigBlockPtr ptr = {0};

    info("iosim.c: started.\n");
    big_file_mpi_set_verbose(1);
    uint64_t * fakedata;
    ptrdiff_t i;
    //
    //+++++++++++++++++ Timelog variables +++++++++++++++++
    double t0, t1;
    log trank;
    trank.create = trank.open = trank.write = trank.read = trank.close = 0;
    //
    //+++++++++++++++++ END +++++++++++++++++

    size_t oldsize = 0;

    switch(mode) {
        case MODE_CREATE:
            info("Creating BigFile\n");
            t0 = MPI_Wtime();
            big_file_mpi_create(&bf, filename, MPI_COMM_WORLD);
            t1 = MPI_Wtime();
            trank.create += t1 - t0;
            info("Created BigFile\n");

            info("Creating BigBlock\n");
            t0 = MPI_Wtime();
            big_file_mpi_create_block(&bf, &bb, "TestBlock", "i8", nmemb, Nfile, size, MPI_COMM_WORLD);
            t1 = MPI_Wtime();
            trank.create += t1 - t0;
            info("Created BigBlock\n");
            big_block_seek(&bb, &ptr, 0);
            break;
        case MODE_UPDATE:
        case MODE_READ:
            info("Opening BigFile\n");
            t0 = MPI_Wtime();
            if(0 != big_file_mpi_open(&bf, filename, MPI_COMM_WORLD)) {
                printf("%s\n", big_file_get_error_message()); 
                return;
            }
            t1 = MPI_Wtime();
            trank.open += t1 - t0;
            info("Opened BigFile\n");

            info("Opening BigBlock\n");
            t0 = MPI_Wtime();
            big_file_mpi_open_block(&bf, &bb, "TestBlock", MPI_COMM_WORLD);
            t1 = MPI_Wtime();
            trank.open += t1 - t0;
            info("Opened BigBlock\n");
            size = bb.size;
            nmemb = bb.nmemb;
            Nfile = bb.Nfile;
            big_block_seek(&bb, &ptr, 0);
        break;
        case MODE_GROW:
            info("Growing BigFile\n");
            t0 = MPI_Wtime();
            if (0 != big_file_mpi_open(&bf, filename, MPI_COMM_WORLD)) {
                printf("%s\n", big_file_get_error_message()); 
                return;
            }
            t1 = MPI_Wtime();
            trank.open += t1 - t0;
            info("Opened BigFile\n");

            info("Opening BigBlock\n");
            t0 = MPI_Wtime();
            big_file_mpi_open_block(&bf, &bb, "TestBlock", MPI_COMM_WORLD);
            oldsize = bb.size;
            big_block_mpi_grow_simple(&bb, Nfile, size, MPI_COMM_WORLD);
            t1 = MPI_Wtime();
            trank.open += t1 - t0;
            info("Opened BigBlock\n");
            nmemb = bb.nmemb;
            big_block_seek(&bb, &ptr, oldsize);
        break;
        default:
            abort();
    }

    /* staggered data layout */
    if(ThisTask % 2 == 0) {
        start = size * ThisTask / NTask;
        int nextTask = ThisTask + 2;
        if(nextTask > NTask) nextTask = NTask;
        localsize = size * nextTask / NTask - start;
    } else {
        start = size * (ThisTask - 1) / NTask;
        localsize = 0;
    }

    info("Writing to `%s`\n", filename);
    info("mode %s\n", MODES[mode]);
    info("nmemb %d\n", nmemb);
    info("Size %td\n", size);
    info("NBlobFiles %td\n", Nfile);
    info("BytesPerBlob %td\n", Nfile);
    info("Ranks %d\n", NTask);
    info("Writers %d\n", Nwriter);
    info("Aggregated %d\n", aggregated);
    info("LocalBytes %td\n", localsize * elsize * nmemb);
    info("LocalSize %td\n", localsize);

    fakedata = malloc(elsize * localsize * nmemb);
    big_array_init(&array, fakedata, "i8", 2, (size_t[]){localsize, nmemb}, NULL);


    switch(mode) {
        case MODE_CREATE:
        case MODE_UPDATE:
        case MODE_GROW:

            info("Initializing FakeData\n");
            for(i = 0; i < localsize; i ++) {
                int j;
                for(j = 0; j < nmemb; j ++) {
                    fakedata[i * nmemb + j] = start + i;
                }
            }
            info("Initialized FakeData\n");
            info("Writing BigBlock\n");
            t0 = MPI_Wtime();
            if(0 != big_block_mpi_write(&bb, &ptr, &array, Nwriter, MPI_COMM_WORLD)) {
                info("Error occured: %s\n", big_file_get_error_message());
            }
            t1 = MPI_Wtime();
            trank.write += t1 - t0;
            info("Written BigBlock\n");
            info("Writing took %f seconds\n", trank.write);
            break;
        case MODE_READ:
            info("Reading BigBlock\n");

            t0 = MPI_Wtime();
            if(0 != big_block_mpi_read(&bb, &ptr, &array, Nwriter, MPI_COMM_WORLD)) {
                info("Error occured: %s\n", big_file_get_error_message());
            }
            t1 = MPI_Wtime();
            trank.read += t1 - t0;
            info("Reading took %f seconds\n", trank.read);
            info("Initializing FakeData\n");
            for(i = 0; i < localsize; i ++) {
                int j;
                for(j = 0; j < nmemb; j ++) {
                    //printf("%lX ", fakedata[i * nmemb + j]);

                    if (fakedata[i * nmemb + j] != start + i) {
                        info("data is corrupted either due to reading or writing\n");
                        abort();

                    }
                }
            }
            //printf("\n");
            info("Initialized FakeData\n");
        break;
    }

    info("Closing BigBlock\n");
    t0 = MPI_Wtime();
    big_block_mpi_close(&bb, MPI_COMM_WORLD);
    t1 = MPI_Wtime();
    trank.close += t1 - t0;
    info("Closed BigBlock\n");

    info("Closing BigFile\n");
    t0 = MPI_Wtime();
    big_file_mpi_close(&bf, MPI_COMM_WORLD);
    t1 = MPI_Wtime();
    trank.close += t1 - t0;
    info("Closed BigFile\n");


    free(fakedata);

    log * times = malloc(sizeof(log) * NTask);

    MPI_Gather(&trank, sizeof(trank), MPI_BYTE, times, sizeof(trank), MPI_BYTE, 0, MPI_COMM_WORLD);

    if (ThisTask == 0){
        char timelog[4096];
        sprintf(timelog, "%s/%s-timelog", filename, MODES[mode]);
        FILE * fp = fopen(timelog, "a+");
        if (!fp){
            info("iosim.c: Couldn't open file %s for writting!\n", timelog);
        }
        else{
            fprintf(fp, "# mode\tNfile\tranks\twriters\titems\tnmemb\n"
                        "%s\t%d\t%d\t%d\t%td\t%d\n",
                         MODES[mode], Nfile, NTask, Nwriter, size, nmemb);

            fprintf(fp, "# Task\tTcreate\t\tTopen\t\tTwrite\t\tTread\t\tTclose\n");
            for (i=0; i<NTask; i++) {
                fprintf(fp, "%04td\t%012.8f\t%012.8f\t%012.8f\t%012.8f\t%012.8f\n",
                    i, times[i].create, times[i].open, times[i].write, times[i].read, times[i].close);
            }
        }
        fclose(fp);
    }
    free(times);
}